

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

LabelInstr * __thiscall
IRBuilderAsmJs::CreateLabel(IRBuilderAsmJs *this,BranchInstr *branchInstr,uint *offset)

{
  IRKind IVar1;
  Instr *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LabelInstr *this_01;
  LabelInstr *this_02;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (this->m_offsetToInstructionCount <= *offset) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x434,"(offset < m_offsetToInstructionCount)",
                         "offset < m_offsetToInstructionCount");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this_00 = this->m_offsetToInstruction[*offset];
    *offset = *offset + 1;
  } while (this_00 == (Instr *)0x0);
  if (this_00->m_prev == (Instr *)0x0) {
    this_01 = (LabelInstr *)0x0;
  }
  else {
    this_01 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(this_00);
  }
  if ((this_01 == (LabelInstr *)0x0) ||
     ((IVar1 = (this_01->super_Instr).m_kind, IVar1 != InstrKindLabel &&
      (IVar1 != InstrKindProfiledLabel)))) {
    this_02 = IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::SetByteCodeOffset(&this_02->super_Instr,*offset);
    if (this_01 == (LabelInstr *)0x0) {
      IR::Instr::InsertBefore(this_00,&this_02->super_Instr);
      this_01 = this_02;
    }
    else {
      IR::Instr::InsertAfter(&this_01->super_Instr,&this_02->super_Instr);
      this_01 = this_02;
    }
  }
  return this_01;
}

Assistant:

IR::LabelInstr *
IRBuilderAsmJs::CreateLabel(IR::BranchInstr * branchInstr, uint & offset)
{
    IR::Instr * targetInstr = nullptr;
    while (targetInstr == nullptr)
    {
        AssertOrFailFast(offset < m_offsetToInstructionCount);
        targetInstr = m_offsetToInstruction[offset];
        ++offset;
    }

    IR::Instr *instrPrev = targetInstr->m_prev;

    if (instrPrev)
    {
        instrPrev = targetInstr->GetPrevRealInstrOrLabel();
    }

    IR::LabelInstr * labelInstr;
    if (instrPrev && instrPrev->IsLabelInstr())
    {
        // Found an existing label at the right offset. Just reuse it.
        labelInstr = instrPrev->AsLabelInstr();
    }
    else
    {
        // No label at the desired offset. Create one.
        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        labelInstr->SetByteCodeOffset(offset);
        if (instrPrev)
        {
            instrPrev->InsertAfter(labelInstr);
        }
        else
        {
            targetInstr->InsertBefore(labelInstr);
        }
    }
    return labelInstr;
}